

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

char * cmsys::SystemTools::AppendStrings(char *str1,char *str2)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar3 = str2;
  if ((str1 != (char *)0x0) && (pcVar3 = str1, str2 != (char *)0x0)) {
    sVar1 = strlen(str1);
    sVar2 = strlen(str2);
    pcVar3 = (char *)operator_new__(sVar1 + sVar2 + 1);
    strcpy(pcVar3,str1);
    strcat(pcVar3 + sVar1,str2);
    return pcVar3;
  }
  pcVar3 = DuplicateString(pcVar3);
  return pcVar3;
}

Assistant:

char* SystemTools::AppendStrings(const char* str1, const char* str2)
{
  if (!str1) {
    return SystemTools::DuplicateString(str2);
  }
  if (!str2) {
    return SystemTools::DuplicateString(str1);
  }
  size_t len1 = strlen(str1);
  char* newstr = new char[len1 + strlen(str2) + 1];
  if (!newstr) {
    return nullptr;
  }
  strcpy(newstr, str1);
  strcat(newstr + len1, str2);
  return newstr;
}